

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O3

void Gia_AigerWrite(Gia_Man_t *pInit,char *pFileName,int fWriteSymbols,int fCompact,
                   int fWriteNewLine)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  byte bVar3;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  Gia_Man_t *p;
  int iVar11;
  int iVar12;
  int iVar13;
  FILE *__stream;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar14;
  Vec_Str_t *pVVar15;
  void *__ptr;
  float *pfVar16;
  size_t sVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  byte *pbVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  undefined4 local_44 [2];
  int local_3c;
  Gia_Man_t *local_38;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  if ((pInit->nXors != 0) || (pInit->nMuxes != 0)) {
    __assert_fail("pInit->nXors == 0 && pInit->nMuxes == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                  ,0x449,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
  }
  if (pInit->vCos->nSize == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Gia_AigerWrite(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar11 = Gia_ManIsNormalized(pInit);
  if (iVar11 == 0) {
    p_00 = Gia_ManDupNormalize(pInit,0);
    Gia_ManTransferMapping(p_00,pInit);
    Gia_ManTransferPacking(p_00,pInit);
    Gia_ManTransferTiming(p_00,pInit);
    iVar11 = pInit->nConstrs;
    p_00->nConstrs = iVar11;
  }
  else {
    iVar11 = pInit->nConstrs;
    p_00 = pInit;
  }
  pcVar18 = "2";
  if (fCompact == 0) {
    pcVar18 = "";
  }
  iVar20 = p_00->vCis->nSize;
  iVar21 = p_00->vCos->nSize;
  uVar27 = ~(iVar21 + iVar20) + p_00->nObjs;
  uVar22 = p_00->nRegs;
  uVar30 = iVar21 - uVar22;
  if (iVar11 != 0) {
    uVar30 = 0;
  }
  fprintf(__stream,"aig%s %u %u %u %u %u",pcVar18,(ulong)(uVar27 + iVar20),(ulong)(iVar20 - uVar22),
          (ulong)uVar22,(ulong)uVar30,(ulong)uVar27);
  if (p_00->nConstrs != 0) {
    fprintf(__stream," %u %u",(ulong)(uint)(p_00->vCos->nSize - (p_00->nRegs + p_00->nConstrs)));
  }
  fputc(10,__stream);
  Gia_ManInvertConstraints(p_00);
  local_3c = fWriteNewLine;
  local_38 = pInit;
  if (fCompact == 0) {
    iVar11 = p_00->nRegs;
    if (0 < iVar11) {
      iVar20 = 0;
      do {
        iVar21 = p_00->vCos->nSize;
        uVar22 = (iVar21 - iVar11) + iVar20;
        if (((int)uVar22 < 0) || (iVar21 <= (int)uVar22)) goto LAB_001d546b;
        iVar21 = p_00->vCos->pArray[uVar22];
        if (((long)iVar21 < 0) || (p_00->nObjs <= iVar21)) goto LAB_001d544c;
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        uVar22 = *(uint *)(p_00->pObjs + iVar21);
        iVar21 = iVar21 - (uVar22 & 0x1fffffff);
        if (iVar21 < 0) goto LAB_001d548a;
        fprintf(__stream,"%u\n",(ulong)((uVar22 >> 0x1d & 1) + iVar21 * 2));
        iVar20 = iVar20 + 1;
        iVar11 = p_00->nRegs;
      } while (iVar20 < iVar11);
    }
    pVVar14 = p_00->vCos;
    uVar28 = (ulong)(uint)pVVar14->nSize;
    if (iVar11 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        if ((int)uVar28 <= lVar19) goto LAB_001d546b;
        iVar11 = pVVar14->pArray[lVar19];
        if (((long)iVar11 < 0) || (p_00->nObjs <= iVar11)) goto LAB_001d544c;
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        uVar22 = *(uint *)(p_00->pObjs + iVar11);
        iVar11 = iVar11 - (uVar22 & 0x1fffffff);
        if (iVar11 < 0) goto LAB_001d548a;
        fprintf(__stream,"%u\n",(ulong)((uVar22 >> 0x1d & 1) + iVar11 * 2));
        lVar19 = lVar19 + 1;
        pVVar14 = p_00->vCos;
        uVar28 = (ulong)pVVar14->nSize;
      } while (lVar19 < (long)(uVar28 - (long)p_00->nRegs));
    }
  }
  else {
    pVVar14 = Gia_AigerCollectLiterals(p_00);
    pVVar15 = Gia_AigerWriteLiterals(pVVar14);
    pcVar18 = pVVar15->pArray;
    fwrite(pcVar18,1,(long)pVVar15->nSize,__stream);
    if (pcVar18 != (char *)0x0) {
      free(pcVar18);
    }
    free(pVVar15);
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
    }
    free(pVVar14);
  }
  Gia_ManInvertConstraints(p_00);
  iVar11 = p_00->nObjs;
  iVar20 = ~(p_00->vCos->nSize + p_00->vCis->nSize) + iVar11;
  iVar21 = iVar20 * 8 + 100;
  __ptr = malloc((long)iVar21);
  if ((long)iVar11 < 1) {
LAB_001d4012:
    iVar13 = 0;
  }
  else {
    pGVar1 = p_00->pObjs;
    lVar19 = 0;
    iVar13 = 0;
    do {
      if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_001d4012;
      uVar28 = *(ulong *)(pGVar1 + lVar19);
      uVar22 = (uint)uVar28;
      if ((~uVar22 & 0x1fffffff) != 0 && -1 < (int)uVar22) {
        iVar12 = (int)lVar19;
        iVar23 = iVar12 - (uVar22 & 0x1fffffff);
        if (iVar23 < 0) {
LAB_001d548a:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar22 = (uint)(uVar28 >> 0x20);
        iVar24 = iVar12 - (uVar22 & 0x1fffffff);
        if (iVar24 < 0) goto LAB_001d548a;
        uVar30 = ((uint)(uVar28 >> 0x1d) & 1) + iVar23 * 2;
        uVar22 = (uVar22 >> 0x1d & 1) + iVar24 * 2;
        if (((p_00->fGiaSimple == 0) && (p_00->nBufs == 0)) && (uVar22 <= uVar30)) {
          __assert_fail("p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                        ,0x490,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
        }
        uVar27 = iVar12 * 2 - uVar22;
        if (0x7f < uVar27) {
          pbVar25 = (byte *)((long)iVar13 + (long)__ptr);
          uVar26 = uVar27;
          do {
            *pbVar25 = (byte)uVar26 | 0x80;
            uVar27 = uVar26 >> 7;
            pbVar25 = pbVar25 + 1;
            iVar13 = iVar13 + 1;
            bVar2 = 0x3fff < uVar26;
            uVar26 = uVar27;
          } while (bVar2);
        }
        iVar12 = iVar13 + 1;
        *(char *)((long)__ptr + (long)iVar13) = (char)uVar27;
        uVar22 = uVar22 - uVar30;
        if (0x7f < uVar22) {
          pbVar25 = (byte *)((long)iVar12 + (long)__ptr);
          uVar30 = uVar22;
          do {
            *pbVar25 = (byte)uVar30 | 0x80;
            uVar22 = uVar30 >> 7;
            pbVar25 = pbVar25 + 1;
            iVar12 = iVar12 + 1;
            bVar2 = 0x3fff < uVar30;
            uVar30 = uVar22;
          } while (bVar2);
        }
        *(char *)((long)__ptr + (long)iVar12) = (char)uVar22;
        if (iVar20 * 8 + 0x5a <= iVar12) {
          puts(
              "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small."
              );
          fclose(__stream);
          if (p_00 == local_38) {
            return;
          }
          goto LAB_001d540c;
        }
        iVar13 = iVar12 + 1;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar11);
  }
  if (iVar21 <= iVar13) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                  ,0x49c,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
  }
  fwrite(__ptr,1,(long)iVar13,__stream);
  iVar11 = local_3c;
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if ((p_00->vNamesIn != (Vec_Ptr_t *)0x0) && (p_00->vNamesOut != (Vec_Ptr_t *)0x0)) {
    iVar20 = p_00->vNamesIn->nSize;
    pVVar14 = p_00->vCis;
    if (iVar20 != pVVar14->nSize) {
      __assert_fail("Vec_PtrSize(p->vNamesIn) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                    ,0x4a5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
    }
    if (p_00->vNamesOut->nSize != p_00->vCos->nSize) {
      __assert_fail("Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                    ,0x4a6,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
    }
    iVar21 = p_00->nRegs;
    if (iVar21 < iVar20) {
      uVar28 = 0;
      do {
        if ((long)iVar20 <= (long)uVar28) goto LAB_001d546b;
        if ((pVVar14->pArray[uVar28] < 0) || (p_00->nObjs <= pVVar14->pArray[uVar28]))
        goto LAB_001d544c;
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        if ((long)p_00->vNamesIn->nSize <= (long)uVar28) goto LAB_001d54a9;
        fprintf(__stream,"i%d %s\n",uVar28 & 0xffffffff,p_00->vNamesIn->pArray[uVar28]);
        uVar28 = uVar28 + 1;
        iVar21 = p_00->nRegs;
        pVVar14 = p_00->vCis;
        iVar20 = pVVar14->nSize;
      } while ((long)uVar28 < (long)(iVar20 - iVar21));
    }
    if (0 < iVar21) {
      uVar28 = 0;
      do {
        iVar20 = p_00->vCis->nSize;
        uVar22 = (iVar20 - iVar21) + (int)uVar28;
        if (((int)uVar22 < 0) || (iVar20 <= (int)uVar22)) goto LAB_001d546b;
        iVar20 = p_00->vCis->pArray[uVar22];
        if ((iVar20 < 0) || (p_00->nObjs <= iVar20)) goto LAB_001d544c;
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        if (p_00->vNamesIn->nSize <= (int)uVar22) goto LAB_001d54a9;
        fprintf(__stream,"l%d %s\n",uVar28,p_00->vNamesIn->pArray[uVar22]);
        uVar22 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar22;
        iVar21 = p_00->nRegs;
      } while ((int)uVar22 < iVar21);
    }
    pVVar14 = p_00->vCos;
    uVar28 = (ulong)(uint)pVVar14->nSize;
    if (iVar21 < pVVar14->nSize) {
      uVar29 = 0;
      do {
        if ((long)(int)uVar28 <= (long)uVar29) {
LAB_001d546b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pVVar14->pArray[uVar29] < 0) || (p_00->nObjs <= pVVar14->pArray[uVar29])) {
LAB_001d544c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        if ((long)p_00->vNamesOut->nSize <= (long)uVar29) {
LAB_001d54a9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        fprintf(__stream,"o%d %s\n",uVar29 & 0xffffffff,p_00->vNamesOut->pArray[uVar29]);
        uVar29 = uVar29 + 1;
        pVVar14 = p_00->vCos;
        uVar28 = (ulong)pVVar14->nSize;
      } while ((long)uVar29 < (long)(uVar28 - (long)p_00->nRegs));
    }
  }
  if (iVar11 == 0) {
    fputc(99,__stream);
  }
  else {
    fwrite("c\n",2,1,__stream);
  }
  if (p_00->pAigExtra != (Gia_Man_t *)0x0) {
    fputc(0x61,__stream);
    pVVar15 = Gia_AigerWriteIntoMemoryStr(p_00->pAigExtra);
    uVar22 = pVVar15->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar4 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_44,1,4,__stream);
    fwrite(pVVar15->pArray,1,(long)pVVar15->nSize,__stream);
    if (pVVar15->pArray != (char *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
  }
  if (p_00->nConstrs != 0) {
    fputc(99,__stream);
    local_44[0] = 0x4000000;
    fwrite(local_44,1,4,__stream);
    uVar22 = p_00->nConstrs;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
  }
  if (p_00->nAnd2Delay != 0) {
    fputc(100,__stream);
    local_44[0] = 0x4000000;
    fwrite(local_44,1,4,__stream);
    uVar22 = p_00->nAnd2Delay;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar4 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
  }
  if ((Tim_Man_t *)p_00->pManTime != (Tim_Man_t *)0x0) {
    pfVar16 = Tim_ManGetArrTimes((Tim_Man_t *)p_00->pManTime);
    if (pfVar16 != (float *)0x0) {
      fputc(0x69,__stream);
      iVar20 = Tim_ManPiNum((Tim_Man_t *)p_00->pManTime);
      uVar22 = iVar20 << 2;
      uVar30 = iVar20 << 2;
      uVar27 = iVar20 * 4;
      uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
      uVar9 = (ushort)(uVar30 >> 8) & 0xff;
      uVar10 = (ushort)uVar27 & 0xff;
      bVar4 = (byte)((uint)(iVar20 << 2) >> 0x18);
      uVar7 = (ushort)bVar4;
      bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
      bVar4 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8)
      ;
      bVar3 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
      bVar6 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
      local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                             CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                      CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                               (0xff < bVar4),
                                               (bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                               (0xff < bVar5))));
      fwrite(local_44,1,4,__stream);
      iVar20 = Tim_ManPiNum((Tim_Man_t *)p_00->pManTime);
      fwrite(pfVar16,1,(long)(iVar20 << 2),__stream);
      free(pfVar16);
    }
    pfVar16 = Tim_ManGetReqTimes((Tim_Man_t *)p_00->pManTime);
    if (pfVar16 != (float *)0x0) {
      fputc(0x6f,__stream);
      iVar20 = Tim_ManPoNum((Tim_Man_t *)p_00->pManTime);
      uVar22 = iVar20 << 2;
      uVar30 = iVar20 << 2;
      uVar27 = iVar20 * 4;
      uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
      uVar9 = (ushort)(uVar30 >> 8) & 0xff;
      uVar10 = (ushort)uVar27 & 0xff;
      bVar4 = (byte)((uint)(iVar20 << 2) >> 0x18);
      uVar7 = (ushort)bVar4;
      bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
      bVar4 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8)
      ;
      bVar5 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
      bVar6 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
      local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                             CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                      CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                               (0xff < bVar4),
                                               (bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                               (0xff < bVar3))));
      fwrite(local_44,1,4,__stream);
      iVar20 = Tim_ManPoNum((Tim_Man_t *)p_00->pManTime);
      fwrite(pfVar16,1,(long)(iVar20 << 2),__stream);
      free(pfVar16);
    }
  }
  if ((p_00->pReprs != (Gia_Rpr_t *)0x0) && (p_00->pNexts != (int *)0x0)) {
    fputc(0x65,__stream);
    pVVar15 = Gia_WriteEquivClasses(p_00);
    uVar22 = pVVar15->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    fwrite(pVVar15->pArray,1,(long)pVVar15->nSize,__stream);
    if (pVVar15->pArray != (char *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
  }
  if (p_00->vFlopClasses != (Vec_Int_t *)0x0) {
    fputc(0x66,__stream);
    iVar20 = p_00->nRegs;
    uVar22 = iVar20 << 2;
    uVar30 = iVar20 << 2;
    uVar27 = iVar20 * 4;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar30 >> 8) & 0xff;
    uVar10 = (ushort)uVar27 & 0xff;
    bVar4 = (byte)((uint)(iVar20 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
    bVar5 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_44,1,4,__stream);
    iVar20 = p_00->vFlopClasses->nSize;
    if (iVar20 != p_00->nRegs) {
      __assert_fail("Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                    ,0x4f5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
    }
    fwrite(p_00->vFlopClasses->pArray,1,(long)iVar20 << 2,__stream);
  }
  if (p_00->vGateClasses != (Vec_Int_t *)0x0) {
    fputc(0x67,__stream);
    iVar20 = p_00->nObjs;
    uVar22 = iVar20 << 2;
    uVar30 = iVar20 << 2;
    uVar27 = iVar20 * 4;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar30 >> 8) & 0xff;
    uVar10 = (ushort)uVar27 & 0xff;
    bVar4 = (byte)((uint)(iVar20 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_44,1,4,__stream);
    iVar20 = p_00->vGateClasses->nSize;
    if (iVar20 != p_00->nObjs) {
      __assert_fail("Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                    ,0x4fd,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
    }
    fwrite(p_00->vGateClasses->pArray,1,(long)iVar20 << 2,__stream);
  }
  if (p_00->pManTime != (void *)0x0) {
    fputc(0x68,__stream);
    pVVar15 = Tim_ManSave((Tim_Man_t *)p_00->pManTime,1);
    uVar22 = pVVar15->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
    fwrite(pVVar15->pArray,1,(long)pVVar15->nSize,__stream);
    if (pVVar15->pArray != (char *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
  }
  if (p_00->vPacking != (Vec_Int_t *)0x0) {
    fputc(0x6b,__stream);
    pVVar15 = Gia_WritePacking(p_00->vPacking);
    uVar22 = pVVar15->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    fwrite(pVVar15->pArray,1,(long)pVVar15->nSize,__stream);
    if (pVVar15->pArray != (char *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
  }
  if (p_00->vEdge1 != (Vec_Int_t *)0x0) {
    pVVar14 = Gia_ManEdgeToArray(p_00);
    fputc(0x77,__stream);
    uVar22 = pVVar14->nSize * 4 + 4;
    uVar8 = (ushort)((uVar22 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)(uVar22 & 0xff00ff);
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar3 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
    iVar20 = pVVar14->nSize;
    uVar22 = iVar20 / 2;
    uVar30 = iVar20 / 2;
    uVar27 = iVar20 / 2;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar30 >> 8) & 0xff;
    uVar10 = (ushort)uVar27 & 0xff;
    bVar4 = (byte)((uint)(iVar20 / 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_44,1,4,__stream);
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        uVar22 = pVVar14->pArray[lVar19];
        uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar22 >> 8) & 0xff;
        uVar10 = (ushort)uVar22 & 0xff;
        bVar4 = (byte)(uVar22 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) -
                (0xff < uVar8);
        bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
        bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
        local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                        CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                 (0xff < bVar5),
                                                 (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                 (0xff < bVar4))));
        fwrite(local_44,1,4,__stream);
        lVar19 = lVar19 + 1;
      } while (lVar19 < pVVar14->nSize);
    }
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
    }
    free(pVVar14);
  }
  if (p_00->vMapping != (Vec_Int_t *)0x0) {
    fputc(0x6d,__stream);
    pVVar15 = Gia_AigerWriteMappingDoc(p_00);
    uVar22 = pVVar15->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    fwrite(pVVar15->pArray,1,(long)pVVar15->nSize,__stream);
    if (pVVar15->pArray != (char *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
  }
  if (p_00->pPlacement != (Gia_Plc_t *)0x0) {
    fputc(0x70,__stream);
    iVar20 = p_00->nObjs;
    uVar22 = iVar20 << 2;
    uVar30 = iVar20 << 2;
    uVar27 = iVar20 * 4;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar30 >> 8) & 0xff;
    uVar10 = (ushort)uVar27 & 0xff;
    bVar4 = (byte)((uint)(iVar20 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    fwrite(p_00->pPlacement,1,(long)p_00->nObjs << 2,__stream);
  }
  if (p_00->vRegClasses != (Vec_Int_t *)0x0) {
    fputc(0x72,__stream);
    uVar22 = p_00->vRegClasses->nSize * 4 + 4;
    uVar8 = (ushort)((uVar22 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)(uVar22 & 0xff00ff);
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar3 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
    uVar22 = p_00->vRegClasses->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_44,1,4,__stream);
    pVVar14 = p_00->vRegClasses;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        uVar22 = pVVar14->pArray[lVar19];
        uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar22 >> 8) & 0xff;
        uVar10 = (ushort)uVar22 & 0xff;
        bVar4 = (byte)(uVar22 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) -
                (0xff < uVar8);
        bVar5 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
        bVar4 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
        local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                               CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                        CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                 (0xff < bVar6),
                                                 (bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                 (0xff < bVar3))));
        fwrite(local_44,1,4,__stream);
        lVar19 = lVar19 + 1;
        pVVar14 = p_00->vRegClasses;
      } while (lVar19 < pVVar14->nSize);
    }
  }
  if (p_00->vRegInits != (Vec_Int_t *)0x0) {
    fputc(0x73,__stream);
    uVar22 = p_00->vRegInits->nSize * 4 + 4;
    uVar8 = (ushort)((uVar22 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)(uVar22 & 0xff00ff);
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
    uVar22 = p_00->vRegInits->nSize;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_44,1,4,__stream);
    pVVar14 = p_00->vRegInits;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        uVar22 = pVVar14->pArray[lVar19];
        uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar22 >> 8) & 0xff;
        uVar10 = (ushort)uVar22 & 0xff;
        bVar4 = (byte)(uVar22 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar6 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) -
                (0xff < uVar8);
        bVar5 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
        bVar4 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
        local_44[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                               CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                        CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                 (0xff < bVar6),
                                                 (bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                 (0xff < bVar3))));
        fwrite(local_44,1,4,__stream);
        lVar19 = lVar19 + 1;
        pVVar14 = p_00->vRegInits;
      } while (lVar19 < pVVar14->nSize);
    }
  }
  if (p_00->vConfigs != (Vec_Int_t *)0x0) {
    fputc(0x62,__stream);
    if (p_00->pCellStr == (char *)0x0) {
      __assert_fail("p->pCellStr != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                    ,0x54d,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
    }
    iVar20 = p_00->vConfigs->nSize;
    sVar17 = strlen(p_00->pCellStr);
    uVar22 = (int)sVar17 + iVar20 * 4 + 1;
    uVar8 = (ushort)((uVar22 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)(uVar22 & 0xff00ff);
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    pcVar18 = p_00->pCellStr;
    sVar17 = strlen(pcVar18);
    fwrite(pcVar18,1,sVar17 + 1,__stream);
    pVVar14 = p_00->vConfigs;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        uVar22 = pVVar14->pArray[lVar19];
        uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar22 >> 8) & 0xff;
        uVar10 = (ushort)uVar22 & 0xff;
        bVar4 = (byte)(uVar22 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) -
                (0xff < uVar8);
        bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
        bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
        local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                        CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                 (0xff < bVar5),
                                                 (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                 (0xff < bVar4))));
        fwrite(local_44,1,4,__stream);
        lVar19 = lVar19 + 1;
        pVVar14 = p_00->vConfigs;
      } while (lVar19 < pVVar14->nSize);
    }
  }
  if (p_00->pSibls != (int *)0x0) {
    fputc(0x71,__stream);
    if ((long)p_00->nObjs < 1) {
      uVar22 = 0;
    }
    else {
      lVar19 = 0;
      uVar22 = 0;
      do {
        uVar30 = 0;
        if (p_00->pSibls != (int *)0x0) {
          uVar30 = (uint)(0 < p_00->pSibls[lVar19]);
        }
        uVar22 = uVar22 + uVar30;
        lVar19 = lVar19 + 1;
      } while (p_00->nObjs != lVar19);
    }
    uVar30 = uVar22 * 8 + 4;
    uVar8 = (ushort)((uVar30 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar30 >> 8) & 0xff;
    uVar10 = (ushort)(uVar30 & 0xff00ff);
    bVar4 = (byte)(uVar30 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar30 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar30 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    iVar20 = p_00->nObjs;
    if (0 < iVar20) {
      uVar28 = 0;
      do {
        if ((p_00->pSibls != (int *)0x0) && (lVar19 = (long)p_00->pSibls[uVar28], lVar19 != 0)) {
          if ((long)uVar28 <= lVar19) {
            __assert_fail("i > Gia_ObjSibl(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                          ,0x560,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
          }
          uVar8 = (ushort)(uVar28 >> 0x10) & 0xff;
          uVar9 = (ushort)(uVar28 >> 8) & 0xff;
          uVar10 = (ushort)uVar28 & 0xff;
          bVar4 = (byte)(uVar28 >> 0x18);
          uVar7 = (ushort)bVar4;
          bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
          bVar5 = ((uVar28 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar28 >> 0x10) -
                  (0xff < uVar8);
          bVar6 = ((uVar28 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar9);
          bVar3 = ((uVar28 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar28 - (0xff < uVar10);
          local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                 CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                          CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                   (0xff < bVar5),
                                                   (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                   (0xff < bVar4))));
          fwrite(local_44,1,4,__stream);
          if (p_00->pSibls == (int *)0x0) {
            uVar22 = 0;
          }
          else {
            uVar22 = p_00->pSibls[uVar28];
          }
          uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
          uVar9 = (ushort)(uVar22 >> 8) & 0xff;
          uVar10 = (ushort)uVar22 & 0xff;
          bVar4 = (byte)(uVar22 >> 0x18);
          uVar7 = (ushort)bVar4;
          bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
          bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) -
                  (0xff < uVar8);
          bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
          bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
          local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                 CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                          CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                   (0xff < bVar5),
                                                   (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                   (0xff < bVar4))));
          fwrite(local_44,1,4,__stream);
          iVar20 = p_00->nObjs;
        }
        uVar28 = uVar28 + 1;
      } while ((long)uVar28 < (long)iVar20);
    }
  }
  if (p_00->pSwitching != (uchar *)0x0) {
    fputc(0x75,__stream);
    uVar22 = p_00->nObjs;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)uVar22 & 0xff;
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    fwrite(p_00->pSwitching,1,(long)p_00->nObjs,__stream);
  }
  p = local_38;
  if (p_00->vObjClasses != (Vec_Int_t *)0x0) {
    fputc(0x76,__stream);
    iVar20 = p_00->nObjs;
    uVar22 = iVar20 << 2;
    uVar30 = iVar20 << 2;
    uVar27 = iVar20 * 4;
    uVar8 = (ushort)(uVar22 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar30 >> 8) & 0xff;
    uVar10 = (ushort)uVar27 & 0xff;
    bVar4 = (byte)((uint)(iVar20 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar27 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar27 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_44,1,4,__stream);
    iVar20 = p_00->vObjClasses->nSize;
    if (iVar20 != p_00->nObjs) {
      __assert_fail("Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAiger.c"
                    ,0x57d,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int, int)");
    }
    fwrite(p_00->vObjClasses->pArray,1,(long)iVar20 << 2,__stream);
  }
  if (p_00->pName != (char *)0x0) {
    fputc(0x6e,__stream);
    sVar17 = strlen(p_00->pName);
    uVar22 = (int)sVar17 + 1;
    uVar8 = (ushort)((uVar22 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar22 >> 8) & 0xff;
    uVar10 = (ushort)(uVar22 & 0xff00ff);
    bVar4 = (byte)(uVar22 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar4 = ((uVar22 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar9);
    bVar5 = ((uVar22 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar22 - (0xff < uVar10);
    local_44[0] = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_44,1,4,__stream);
    pcVar18 = p_00->pName;
    sVar17 = strlen(pcVar18);
    fwrite(pcVar18,1,sVar17,__stream);
    fputc(0,__stream);
  }
  if (iVar11 != 0) {
    fwrite("c\n",2,1,__stream);
  }
  pcVar18 = Gia_TimeStamp();
  fprintf(__stream,"\nThis file was produced by the GIA package in ABC on %s\n",pcVar18);
  fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
  fclose(__stream);
  if (p_00 == p) {
    return;
  }
  Gia_ManTransferTiming(p,p_00);
LAB_001d540c:
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_AigerWrite( Gia_Man_t * pInit, char * pFileName, int fWriteSymbols, int fCompact, int fWriteNewLine )
{
    int fVerbose = XAIG_VERBOSE;
    FILE * pFile;
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStrExt;
    int i, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;
    assert( pInit->nXors == 0 && pInit->nMuxes == 0 );

    if ( Gia_ManCoNum(pInit) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWrite(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // create normalized AIG
    if ( !Gia_ManIsNormalized(pInit) )
    {
//        printf( "Gia_AigerWrite(): Normalizing AIG for writing.\n" );
        p = Gia_ManDupNormalize( pInit, 0 );
        Gia_ManTransferMapping( p, pInit );
        Gia_ManTransferPacking( p, pInit );
        Gia_ManTransferTiming( p, pInit );
        p->nConstrs   = pInit->nConstrs;
    }
    else
        p = pInit;

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Gia_ManCiNum(p) + Gia_ManAndNum(p), 
        Gia_ManPiNum(p),
        Gia_ManRegNum(p),
        Gia_ManConstrNum(p) ? 0 : Gia_ManPoNum(p),
        Gia_ManAndNum(p) );
    // write the extended header "B C J F"
    if ( Gia_ManConstrNum(p) )
        fprintf( pFile, " %u %u", Gia_ManPoNum(p) - Gia_ManConstrNum(p), Gia_ManConstrNum(p) );
    fprintf( pFile, "\n" ); 

    Gia_ManInvertConstraints( p );
    if ( !fCompact ) 
    {
        // write latch drivers
        Gia_ManForEachRi( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
        // write PO drivers
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
    }
    else
    {
        Vec_Int_t * vLits = Gia_AigerCollectLiterals( p );
        Vec_Str_t * vBinary = Gia_AigerWriteLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Gia_ManInvertConstraints( p );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 8 * Gia_ManAndNum(p) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit  = Abc_Var2Lit( i, 0 );
        uLit0 = Gia_ObjFaninLit0( pObj, i );
        uLit1 = Gia_ObjFaninLit1( pObj, i );
        assert( p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit  - uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            if ( p != pInit )
                Gia_ManStop( p );
            return;
        }
    }
    assert( Pos < nBufferSize );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( p->vNamesIn && p->vNamesOut )
    {
        assert( Vec_PtrSize(p->vNamesIn)  == Gia_ManCiNum(p) );
        assert( Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p) );
        // write PIs
        Gia_ManForEachPi( p, pObj, i )
            fprintf( pFile, "i%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, i) );
        // write latches
        Gia_ManForEachRo( p, pObj, i )
            fprintf( pFile, "l%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, Gia_ManPiNum(p) + i) );
        // write POs
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "o%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesOut, i) );
    }

    // write the comment
    if ( fWriteNewLine ) 
        fprintf( pFile, "c\n" );
    else
        fprintf( pFile, "c" );

    // write additional AIG
    if ( p->pAigExtra )
    {
        fprintf( pFile, "a" );
        vStrExt = Gia_AigerWriteIntoMemoryStr( p->pAigExtra );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"a\".\n" );
    }
    // write constraints
    if ( p->nConstrs )
    {
        fprintf( pFile, "c" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nConstrs );
    }
    // write timing information
    if ( p->nAnd2Delay )
    {
        fprintf( pFile, "d" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nAnd2Delay );
    }
    if ( p->pManTime )
    {
        float * pTimes;
        pTimes = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "i" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"i\".\n" );
        }
        pTimes = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "o" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"o\".\n" );
        }
    }
    // write equivalences
    if ( p->pReprs && p->pNexts )
    {
        extern Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p );
        fprintf( pFile, "e" );
        vStrExt = Gia_WriteEquivClasses( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
    // write flop classes
    if ( p->vFlopClasses )
    {
        fprintf( pFile, "f" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManRegNum(p) );
        assert( Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p) );
        fwrite( Vec_IntArray(p->vFlopClasses), 1, 4*Gia_ManRegNum(p), pFile );
    }
    // write gate classes
    if ( p->vGateClasses )
    {
        fprintf( pFile, "g" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vGateClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write hierarchy info
    if ( p->pManTime )
    {
        fprintf( pFile, "h" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 1 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"h\".\n" );
    }
    // write packing
    if ( p->vPacking )
    {
        extern Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking );
        fprintf( pFile, "k" );
        vStrExt = Gia_WritePacking( p->vPacking );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"k\".\n" );
    }
    // write edges
    if ( p->vEdge1 )
    {
        Vec_Int_t * vPairs = Gia_ManEdgeToArray( p );
        int i;
        fprintf( pFile, "w" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(vPairs)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(vPairs)/2 );
        for ( i = 0; i < Vec_IntSize(vPairs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(vPairs, i) );
        Vec_IntFree( vPairs );
    }
    // write mapping
    if ( Gia_ManHasMapping(p) )
    {
        extern Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p );
        fprintf( pFile, "m" );
        vStrExt = Gia_AigerWriteMappingDoc( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"m\".\n" );
    }
    // write placement
    if ( p->pPlacement )
    {
        fprintf( pFile, "p" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        fwrite( p->pPlacement, 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write register classes
    if ( p->vRegClasses )
    {
        int i;
        fprintf( pFile, "r" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegClasses)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegClasses) );
        for ( i = 0; i < Vec_IntSize(p->vRegClasses); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegClasses, i) );
    }
    // write register inits
    if ( p->vRegInits )
    {
        int i;
        fprintf( pFile, "s" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegInits)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegInits) );
        for ( i = 0; i < Vec_IntSize(p->vRegInits); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegInits, i) );
    }
    // write configuration data
    if ( p->vConfigs )
    {
        fprintf( pFile, "b" );
        assert( p->pCellStr != NULL );
        Gia_FileWriteBufferSize( pFile, 4*Vec_IntSize(p->vConfigs) + strlen(p->pCellStr) + 1 );
        fwrite( p->pCellStr, 1, strlen(p->pCellStr) + 1, pFile );
//        fwrite( Vec_IntArray(p->vConfigs), 1, 4*Vec_IntSize(p->vConfigs), pFile );
        for ( i = 0; i < Vec_IntSize(p->vConfigs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vConfigs, i) );
    }
    // write choices
    if ( Gia_ManHasChoices(p) )
    {
        int i, nPairs = 0;
        fprintf( pFile, "q" );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            nPairs += (Gia_ObjSibl(p, i) > 0);
        Gia_FileWriteBufferSize( pFile, 4*(nPairs * 2 + 1) );
        Gia_FileWriteBufferSize( pFile, nPairs );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( Gia_ObjSibl(p, i) )
            {
                assert( i > Gia_ObjSibl(p, i) );
                Gia_FileWriteBufferSize( pFile, i );
                Gia_FileWriteBufferSize( pFile, Gia_ObjSibl(p, i) );
            }
        if ( fVerbose ) printf( "Finished writing extension \"q\".\n" );
    }
    // write switching activity
    if ( p->pSwitching )
    {
        fprintf( pFile, "u" );
        Gia_FileWriteBufferSize( pFile, Gia_ManObjNum(p) );
        fwrite( p->pSwitching, 1, Gia_ManObjNum(p), pFile );
    }
/*
    // write timing information
    if ( p->pManTime )
    {
        fprintf( pFile, "t" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 0 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
*/
    // write object classes
    if ( p->vObjClasses )
    {
        fprintf( pFile, "v" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vObjClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write name
    if ( p->pName )
    {
        fprintf( pFile, "n" );
        Gia_FileWriteBufferSize( pFile, strlen(p->pName)+1 );
        fwrite( p->pName, 1, strlen(p->pName), pFile );
        fprintf( pFile, "%c", '\0' );
    }
    // write comments
    if ( fWriteNewLine )
        fprintf( pFile, "c\n" );
    fprintf( pFile, "\nThis file was produced by the GIA package in ABC on %s\n", Gia_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
    if ( p != pInit )
    {
        Gia_ManTransferTiming( pInit, p );
        Gia_ManStop( p );
    }
}